

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateBuilderParsingMethods
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *in_RDX;
  string local_30;
  
  ClassName_abi_cxx11_(&local_30,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public Builder mergeFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  $classname$ parsedMessage = null;\n  try {\n    parsedMessage = PARSER.parsePartialFrom(input, extensionRegistry);\n  } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n    parsedMessage = ($classname$) e.getUnfinishedMessage();\n    throw e;\n  } finally {\n    if (parsedMessage != null) {\n      mergeFrom(parsedMessage);\n    }\n  }\n  return this;\n}\n"
                     ,"classname",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateBuilderParsingMethods(io::Printer* printer) {
  printer->Print(
    "public Builder mergeFrom(\n"
    "    com.google.protobuf.CodedInputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  $classname$ parsedMessage = null;\n"
    "  try {\n"
    "    parsedMessage = PARSER.parsePartialFrom(input, extensionRegistry);\n"
    "  } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
    "    parsedMessage = ($classname$) e.getUnfinishedMessage();\n"
    "    throw e;\n"
    "  } finally {\n"
    "    if (parsedMessage != null) {\n"
    "      mergeFrom(parsedMessage);\n"
    "    }\n"
    "  }\n"
    "  return this;\n"
    "}\n",
    "classname", ClassName(descriptor_));
}